

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

void do_close(uv_tcp_t *handle)

{
  int iVar1;
  uv_tcp_t *extraout_RAX;
  uv_tcp_t *puVar2;
  code *pcVar3;
  uv_tcp_t *puVar4;
  uv_shutdown_t *puVar5;
  long lVar6;
  undefined1 auStack_50 [16];
  uv_tcp_t *puStack_40;
  
  if (shutdown_before_close == '\x01') {
    puVar5 = &shutdown_req;
    pcVar3 = (code *)handle;
    iVar1 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_close_reset(handle,close_cb);
      if (iVar1 == -0x16) goto LAB_00171e49;
      do_close_cold_4();
      goto LAB_00171e1b;
    }
    do_close_cold_3();
LAB_00171e5d:
    do_close_cold_1();
    puVar4 = (uv_tcp_t *)pcVar3;
  }
  else {
LAB_00171e1b:
    pcVar3 = close_cb;
    puVar5 = (uv_shutdown_t *)handle;
    iVar1 = uv_tcp_close_reset();
    if (iVar1 != 0) goto LAB_00171e5d;
    puVar5 = &shutdown_req;
    puVar4 = handle;
    iVar1 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
    if (iVar1 == -0x6b) {
LAB_00171e49:
      uv_close(&tcp_server,0);
      return;
    }
  }
  do_close_cold_2();
  puVar2 = (uv_tcp_t *)(((uv_tcp_t *)puVar5)->u).reserved[2];
  if (client_close == '\x01') {
    if (puVar2 == &tcp_client) goto LAB_00171e92;
    shutdown_cb_cold_2();
    puVar2 = extraout_RAX;
  }
  if (puVar2 == &tcp_accepted) {
LAB_00171e92:
    shutdown_cb_called = shutdown_cb_called + 1;
    return;
  }
  shutdown_cb_cold_1();
  if (client_close == '\x01') {
    if ((uv_tcp_t *)puVar5 == &tcp_client) goto LAB_00171ec6;
    close_cb_cold_2();
  }
  if ((uv_tcp_t *)puVar5 != &tcp_accepted) {
    close_cb_cold_1();
    puStack_40 = handle;
    if ((uv_connect_t *)puVar5 == &connect_req) {
      uv_read_start(&tcp_client,alloc_cb,read_cb2);
      auStack_50 = uv_buf_init("PING",4);
      lVar6 = 0;
      while( true ) {
        puVar5 = (uv_shutdown_t *)((long)write_reqs[0].reserved + lVar6 + -0x10);
        puVar4 = &tcp_client;
        iVar1 = uv_write(puVar5,&tcp_client,auStack_50,1,write_cb);
        if (iVar1 != 0) break;
        lVar6 = lVar6 + 0xc0;
        if (lVar6 == 0x300) {
          if (client_close == '\x01') {
            do_close(&tcp_client);
          }
          return;
        }
      }
      connect_cb_cold_2();
    }
    connect_cb_cold_1();
    if ((uv_tcp_t *)puVar5 == &tcp_client) {
      if (puVar4 == (uv_tcp_t *)0xfffffffffffff001) {
        uv_close(&tcp_client,0);
        return;
      }
      return;
    }
    read_cb2_cold_1();
    if (close_cb_called == 0) {
      if ((uv_tcp_t *)((uv_tcp_t *)puVar5)->next_closing == &tcp_client) {
        write_cb_called = write_cb_called + 1;
        return;
      }
    }
    else {
      write_cb_cold_1();
    }
    write_cb_cold_2();
    iVar1 = uv_is_closing();
    if (iVar1 != 0) {
      return;
    }
    uv_close(puVar5,0);
    return;
  }
LAB_00171ec6:
  close_cb_called = close_cb_called + 1;
  return;
}

Assistant:

static void do_close(void* handle) {
  close_cb_called = 0;
  uv_close((uv_handle_t*)handle, close_cb);
  ASSERT(close_cb_called == 0);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(close_cb_called == 1);
}